

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O0

void __thiscall xemmai::t_module::t_module(t_module *this,iterator a_entry,t_object *a_body)

{
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  t_object *__p;
  pointer ppVar1;
  __pointer_type ptVar2;
  long *in_FS_OFFSET;
  t_object *a_body_local;
  t_module *this_local;
  iterator a_entry_local;
  __pointer_type p;
  
  (this->v_entry)._M_node = a_entry._M_node;
  t_slot::t_slot(&this->v_body,a_body);
  __p = t_object::f_of(this);
  ppVar1 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>
           ::operator->(&this->v_entry);
  if ((t_object *)0x4 < __p) {
    this_00 = *(t_queue<128UL> **)(*in_FS_OFFSET + -0x68);
    *this_00->v_head = __p;
    if (this_00->v_head == this_00->v_next) {
      t_slot::t_queue<128UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
  }
  ptVar2 = std::atomic<xemmai::t_object_*>::exchange(&(ppVar1->second).v_p,__p,relaxed);
  if ((__pointer_type)0x4 < ptVar2) {
    this_01 = *(t_queue<256UL> **)(*in_FS_OFFSET + -0x70);
    *this_01->v_head = ptVar2;
    if (this_01->v_head == this_01->v_next) {
      t_slot::t_queue<256UL>::f_next(this_01);
    }
    else {
      this_01->v_head = this_01->v_head + 1;
    }
  }
  return;
}

Assistant:

t_module(std::map<std::wstring, t_slot, std::less<>>::iterator a_entry, t_object* a_body) : v_entry(a_entry), v_body(a_body)
	{
		v_entry->second = t_object::f_of(this);
	}